

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> * __thiscall
tinyusdz::GeomMesh::get_points
          (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
           *__return_storage_ptr__,GeomMesh *this,double time,TimeSampleInterpolationType interp)

{
  bool bVar1;
  value_type *this_00;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> val;
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  pv;
  _Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> local_88;
  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
          ::authored(&this->points);
  if (((bVar1) && ((this->points)._blocked == false)) &&
     (((this->points)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_finish ==
       (this->points)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start || (((this->points)._attrib.has_value_ & 1U) != 0)))
     ) {
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
    ::optional(&local_68,&(this->points)._attrib);
    if (local_68.has_value_ == true) {
      local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = nonstd::optional_lite::
                optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                ::value(&local_68);
      bVar1 = Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
              ::get(this_00,time,
                    (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                    &local_88,interp);
      if (bVar1) {
        std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
        _M_move_assign(__return_storage_ptr__,&local_88);
      }
      std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
      ~_Vector_base(&local_88);
    }
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
    ::~optional(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<value::point3f> GeomMesh::get_points(
    double time, value::TimeSampleInterpolationType interp) const {
  std::vector<value::point3f> dst;

  if (!points.authored() || points.is_blocked()) {
    return dst;
  }

  if (points.is_connection()) {
    // TODO: connection
    return dst;
  }

  if (auto pv = points.get_value()) {
    std::vector<value::point3f> val;
    if (pv.value().get(time, &val, interp)) {
      dst = std::move(val);
    }
  }

  return dst;
}